

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalBatchCopyToFile::RepartitionBatches
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p,
          idx_t min_index,bool final)

{
  StateWithBlockableTasks *pSVar1;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *puVar2;
  _func_int **pp_Var3;
  _Head_base<0UL,_duckdb::FixedRawBatchData_*,_false> _Var4;
  idx_t iVar5;
  PhysicalOperator *pPVar6;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  _Base_ptr p_Var11;
  pointer pFVar12;
  pointer pCVar13;
  type this_00;
  DataChunk *input;
  const_reference pvVar14;
  ColumnDataCollection *pCVar15;
  _Head_base<0UL,_duckdb::FixedRawBatchData_*,_false> _Var16;
  ulong uVar17;
  _Rb_tree_node_base *p_Var18;
  __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  *p_Var19;
  ulong uVar20;
  pointer *__ptr;
  undefined3 in_register_00000081;
  ulong uVar21;
  _Self __tmp;
  const_iterator __position;
  unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
  append_batch;
  templated_unique_single_t new_collection_1;
  idx_t max_batch_index;
  vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_true>
  raw_batches;
  ColumnDataAppendState append_state;
  templated_unique_single_t new_collection;
  ColumnDataChunkIterator __begin2;
  _Head_base<0UL,_duckdb::FixedRawBatchData_*,_false> local_298;
  __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  *local_290;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_288;
  _Head_base<0UL,_duckdb::BatchCopyTask_*,_false> local_280;
  _Head_base<0UL,_duckdb::BatchCopyTask_*,_false> local_278;
  _Head_base<0UL,_duckdb::BatchCopyTask_*,_false> local_270;
  PhysicalBatchCopyToFile *local_268;
  BatchTaskManager<duckdb::BatchCopyTask> *local_260;
  undefined4 local_254;
  pthread_mutex_t *local_250;
  GlobalSinkState *local_248;
  ClientContext *local_240;
  _func_int **local_238;
  key_type local_230;
  vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  local_228;
  __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  *local_208;
  ColumnDataAppendState local_200;
  ColumnDataChunkIterationHelper local_1a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  local_250 = (pthread_mutex_t *)
              &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_268 = this;
  local_240 = context;
  iVar10 = pthread_mutex_lock(local_250);
  if (iVar10 != 0) {
    ::std::__throw_system_error(iVar10);
  }
  if (gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
      __prev == (__pthread_internal_list *)0x0) goto LAB_01584c2d;
  if (!final) {
    if ((gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] & 1U)
        != 0) goto LAB_01584c2d;
    uVar21 = 0;
    for (p_Var18 = *(_Rb_tree_node_base **)
                    ((long)&gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base.
                            _M_mutex + 8);
        ((StateWithBlockableTasks *)p_Var18 != &gstate_p[5].super_StateWithBlockableTasks &&
        (*(ulong *)(p_Var18 + 1) < min_index));
        p_Var18 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var18)) {
      pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                              *)&p_Var18[1]._M_parent);
      pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator->(&pFVar12->collection);
      uVar21 = uVar21 + pCVar13->count;
    }
    if (uVar21 < *(ulong *)&gstate_p[4].state) goto LAB_01584c2d;
  }
  local_248 = gstate_p + 5;
  local_230 = 0;
  local_228.
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __position._M_node =
       *(_Base_ptr *)
        ((long)&gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8);
  local_254 = CONCAT31(in_register_00000081,final);
  if ((StateWithBlockableTasks *)__position._M_node != &gstate_p[5].super_StateWithBlockableTasks) {
    do {
      if (min_index <= *(ulong *)(__position._M_node + 1)) break;
      local_230 = *(ulong *)(__position._M_node + 1);
      ::std::
      vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>,std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>,std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>
                  *)&local_228,
                 (unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  *)&__position._M_node[1]._M_parent);
      p_Var11 = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
                      *)local_248,__position);
      __position._M_node = p_Var11;
    } while ((StateWithBlockableTasks *)p_Var11 != &gstate_p[5].super_StateWithBlockableTasks);
  }
  local_260 = (BatchTaskManager<duckdb::BatchCopyTask> *)
              ((long)&gstate_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
              0x10);
  local_298._M_head_impl = (FixedRawBatchData *)0x0;
  local_200.current_chunk_state.handles._M_h._M_buckets =
       &local_200.current_chunk_state.handles._M_h._M_single_bucket;
  local_200.current_chunk_state.handles._M_h._M_bucket_count = 1;
  local_200.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_200.current_chunk_state.handles._M_h._M_element_count = 0;
  local_200.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_200.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_200.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_200.current_chunk_state.properties = INVALID;
  local_200.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               *)local_228.
                 super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  if (local_228.
      super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_228.
      super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_268 = (PhysicalBatchCopyToFile *)&(local_268->super_PhysicalOperator).children;
    local_238 = (_func_int **)&PTR__PrepareBatchTask_024a0668;
    p_Var19 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               *)local_228.
                 super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_290 = p_Var19;
      if (local_298._M_head_impl == (FixedRawBatchData *)0x0) {
        pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                *)p_Var19);
        pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->(&pFVar12->collection);
        _Var4._M_head_impl = local_298._M_head_impl;
        uVar21 = *(ulong *)&gstate_p[4].state;
        if (uVar21 == 0) {
LAB_01584663:
          LOCK();
          pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
          pp_Var3 = *(_func_int ***)pSVar1;
          *(long *)pSVar1 = *(long *)pSVar1 + 1;
          UNLOCK();
          local_278._M_head_impl = (BatchCopyTask *)operator_new(0x18);
          _Var4._M_head_impl =
               (((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                  *)&local_290->_M_t)->_M_t).
               super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
               .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl;
          (((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
             *)&local_290->_M_t)->_M_t).
          super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
          .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl =
               (FixedRawBatchData *)0x0;
          (local_278._M_head_impl)->_vptr_BatchCopyTask = local_238;
          local_278._M_head_impl[1]._vptr_BatchCopyTask = pp_Var3;
          local_278._M_head_impl[2]._vptr_BatchCopyTask = (_func_int **)_Var4._M_head_impl;
          BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                    (local_260,
                     (unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                      *)&local_278);
          if (local_278._M_head_impl != (BatchCopyTask *)0x0) {
            (*(local_278._M_head_impl)->_vptr_BatchCopyTask[1])();
          }
          local_278._M_head_impl = (BatchCopyTask *)0x0;
          _Var16._M_head_impl = local_298._M_head_impl;
LAB_015846c8:
          local_298._M_head_impl = _Var16._M_head_impl;
          p_Var19 = local_290;
          ::std::
          __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ::reset(local_290,(pointer)0x0);
        }
        else {
          uVar20 = pCVar13->count - uVar21;
          uVar17 = -uVar20;
          if (0 < (long)uVar20) {
            uVar17 = uVar20;
          }
          if (uVar17 < 0x800) goto LAB_01584663;
          if (pCVar13->count < uVar21) {
            _Var16._M_head_impl =
                 (((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                    *)&p_Var19->_M_t)->_M_t).
                 super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
                 .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl;
            (((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               *)&p_Var19->_M_t)->_M_t).
            super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
            .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl =
                 (FixedRawBatchData *)0x0;
            if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
              puVar2 = &(local_298._M_head_impl)->collection;
              local_298._M_head_impl = _Var16._M_head_impl;
              ::std::
              unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ::~unique_ptr(&puVar2->
                             super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                           );
              operator_delete(_Var4._M_head_impl);
              _Var16._M_head_impl = local_298._M_head_impl;
            }
            goto LAB_015846c8;
          }
          pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                               local_268,0);
          pPVar6 = pvVar14->_M_data;
          pCVar15 = (ColumnDataCollection *)operator_new(0x70);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d0,
                     &(pPVar6->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
          ColumnDataCollection::ColumnDataCollection
                    (pCVar15,local_240,(vector<duckdb::LogicalType,_true> *)&local_d0,
                     BUFFER_MANAGER_ALLOCATOR);
          local_170.collection = pCVar15;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d0)
          ;
          pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                  *)&local_170);
          ColumnDataCollection::SetPartitionIndex(pCVar13,0);
          _Var16._M_head_impl = (FixedRawBatchData *)operator_new(0x10);
          pCVar15 = local_170.collection;
          _Var4._M_head_impl = local_298._M_head_impl;
          local_170.collection = (ColumnDataCollection *)0x0;
          (_Var16._M_head_impl)->memory_usage = 0;
          ((_Var16._M_head_impl)->collection).
          super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
          .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl = pCVar15;
          if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
            puVar2 = &(local_298._M_head_impl)->collection;
            local_298._M_head_impl = _Var16._M_head_impl;
            ::std::
            unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ::~unique_ptr(&puVar2->
                           super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                         );
            operator_delete(_Var4._M_head_impl);
            _Var16._M_head_impl = local_298._M_head_impl;
          }
          local_298._M_head_impl = _Var16._M_head_impl;
          pCVar15 = local_170.collection;
          p_Var19 = local_290;
          if (local_170.collection != (ColumnDataCollection *)0x0) {
            ColumnDataCollection::~ColumnDataCollection(local_170.collection);
            operator_delete(pCVar15);
            p_Var19 = local_290;
          }
        }
        if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
          pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                    ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                  *)&local_298);
          pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    ::operator->(&pFVar12->collection);
          ColumnDataCollection::InitializeAppend(pCVar13,&local_200);
        }
      }
      if ((((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
             *)&p_Var19->_M_t)->_M_t).
          super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
          .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl !=
          (FixedRawBatchData *)0x0) {
        pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                *)p_Var19);
        this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator*(&pFVar12->collection);
        pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                *)local_290);
        iVar5 = pFVar12->memory_usage;
        pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                *)&local_298);
        pFVar12->memory_usage = pFVar12->memory_usage + iVar5;
        ColumnDataCollection::Chunks(&local_1a8,this_00);
        ColumnDataChunkIterationHelper::begin(&local_d0,&local_1a8);
        ColumnDataChunkIterationHelper::end(&local_170,&local_1a8);
        p_Var19 = local_290;
        while (bVar9 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                                 (&local_d0,&local_170), bVar9) {
          input = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_d0);
          pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                    ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                  *)&local_298);
          pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    ::operator->(&pFVar12->collection);
          ColumnDataCollection::Append(pCVar13,&local_200,input);
          pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                    ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                  *)&local_298);
          pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    ::operator->(&pFVar12->collection);
          if (*(ulong *)&gstate_p[4].state <= pCVar13->count) {
            LOCK();
            pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
            pp_Var3 = *(_func_int ***)pSVar1;
            *(long *)pSVar1 = *(long *)pSVar1 + 1;
            UNLOCK();
            local_280._M_head_impl = (BatchCopyTask *)operator_new(0x18);
            _Var4._M_head_impl = local_298._M_head_impl;
            local_298._M_head_impl = (FixedRawBatchData *)0x0;
            (local_280._M_head_impl)->_vptr_BatchCopyTask = local_238;
            local_280._M_head_impl[1]._vptr_BatchCopyTask = pp_Var3;
            local_280._M_head_impl[2]._vptr_BatchCopyTask = (_func_int **)_Var4._M_head_impl;
            BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                      (local_260,
                       (unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                        *)&local_280);
            if (local_280._M_head_impl != (BatchCopyTask *)0x0) {
              (*(local_280._M_head_impl)->_vptr_BatchCopyTask[1])();
            }
            local_280._M_head_impl = (BatchCopyTask *)0x0;
            pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                                 local_268,0);
            pPVar6 = pvVar14->_M_data;
            pCVar15 = (ColumnDataCollection *)operator_new(0x70);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                      (&local_188,
                       &(pPVar6->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
            ColumnDataCollection::ColumnDataCollection
                      (pCVar15,local_240,(vector<duckdb::LogicalType,_true> *)&local_188,
                       BUFFER_MANAGER_ALLOCATOR);
            local_288._M_head_impl = pCVar15;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      (&local_188);
            pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                      ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                    *)&local_288);
            ColumnDataCollection::SetPartitionIndex(pCVar13,0);
            _Var16._M_head_impl = (FixedRawBatchData *)operator_new(0x10);
            _Var7._M_head_impl = local_288._M_head_impl;
            _Var4._M_head_impl = local_298._M_head_impl;
            local_288._M_head_impl = (ColumnDataCollection *)0x0;
            (_Var16._M_head_impl)->memory_usage = 0;
            ((_Var16._M_head_impl)->collection).
            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
                 _Var7._M_head_impl;
            if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
              puVar2 = &(local_298._M_head_impl)->collection;
              local_298._M_head_impl = _Var16._M_head_impl;
              ::std::
              unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ::~unique_ptr(&puVar2->
                             super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                           );
              operator_delete(_Var4._M_head_impl);
              _Var16._M_head_impl = local_298._M_head_impl;
            }
            local_298._M_head_impl = _Var16._M_head_impl;
            pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                      ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                    *)&local_298);
            pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                      ::operator->(&pFVar12->collection);
            ColumnDataCollection::InitializeAppend(pCVar13,&local_200);
            _Var7._M_head_impl = local_288._M_head_impl;
            p_Var19 = local_290;
            if (local_288._M_head_impl != (ColumnDataCollection *)0x0) {
              ColumnDataCollection::~ColumnDataCollection(local_288._M_head_impl);
              operator_delete(_Var7._M_head_impl);
              p_Var19 = local_290;
            }
          }
          ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_d0);
        }
        if (local_170.scan_chunk.internal.
            super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.scan_chunk.internal.
                     super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_170.scan_state.column_ids.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.scan_state.column_ids.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_170.scan_state);
        if (local_d0.scan_chunk.internal.
            super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.scan_chunk.internal.
                     super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_d0.scan_state.column_ids.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.scan_state.column_ids.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_d0.scan_state);
        if (local_1a8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.column_ids.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      p_Var19 = p_Var19 + 1;
    } while (p_Var19 != local_208);
  }
  uVar8 = local_254;
  if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
    pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
              ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                            *)&local_298);
    pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&pFVar12->collection);
    if (pCVar13->count != 0) {
      if ((char)uVar8 == '\0') {
        pFVar12 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                  ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                                *)&local_298);
        pCVar13 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->(&pFVar12->collection);
        if (*(long *)&gstate_p[4].state != 0) {
          uVar17 = pCVar13->count - *(long *)&gstate_p[4].state;
          uVar21 = -uVar17;
          if (0 < (long)uVar17) {
            uVar21 = uVar17;
          }
          if (0x7ff < uVar21) {
            p_Var19 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                       *)::std::
                         map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
                         ::operator[]((map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
                                       *)local_248,&local_230);
            _Var4._M_head_impl = local_298._M_head_impl;
            local_298._M_head_impl = (FixedRawBatchData *)0x0;
            ::std::
            __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
            ::reset(p_Var19,_Var4._M_head_impl);
            goto LAB_01584b90;
          }
        }
      }
      LOCK();
      pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
      pp_Var3 = *(_func_int ***)pSVar1;
      *(long *)pSVar1 = *(long *)pSVar1 + 1;
      UNLOCK();
      local_270._M_head_impl = (BatchCopyTask *)operator_new(0x18);
      _Var4._M_head_impl = local_298._M_head_impl;
      local_298._M_head_impl = (FixedRawBatchData *)0x0;
      (local_270._M_head_impl)->_vptr_BatchCopyTask = (_func_int **)&PTR__PrepareBatchTask_024a0668;
      local_270._M_head_impl[1]._vptr_BatchCopyTask = pp_Var3;
      local_270._M_head_impl[2]._vptr_BatchCopyTask = (_func_int **)_Var4._M_head_impl;
      BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                (local_260,
                 (unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                  *)&local_270);
      if (local_270._M_head_impl != (BatchCopyTask *)0x0) {
        (*(local_270._M_head_impl)->_vptr_BatchCopyTask[1])();
      }
      local_270._M_head_impl = (BatchCopyTask *)0x0;
    }
  }
LAB_01584b90:
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&local_200.vector_data.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
            );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_200);
  _Var4._M_head_impl = local_298._M_head_impl;
  if (local_298._M_head_impl != (FixedRawBatchData *)0x0) {
    ::std::
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
    ~unique_ptr(&((local_298._M_head_impl)->collection).
                 super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               );
    operator_delete(_Var4._M_head_impl);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ::~vector(&local_228);
LAB_01584c2d:
  pthread_mutex_unlock(local_250);
  return;
}

Assistant:

void PhysicalBatchCopyToFile::RepartitionBatches(ClientContext &context, GlobalSinkState &gstate_p, idx_t min_index,
                                                 bool final) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	auto &task_manager = gstate.task_manager;

	// repartition batches until the min index is reached
	lock_guard<mutex> l(gstate.lock);
	if (gstate.raw_batches.empty()) {
		return;
	}
	if (!final) {
		if (gstate.any_finished) {
			// we only repartition in ::NextBatch if all threads are still busy processing batches
			// otherwise we might end up repartitioning a lot of data with only a few threads remaining
			// which causes erratic performance
			return;
		}
		// if this is not the final flush we first check if we have enough data to merge past the batch threshold
		idx_t candidate_rows = 0;
		for (auto entry = gstate.raw_batches.begin(); entry != gstate.raw_batches.end(); entry++) {
			if (entry->first >= min_index) {
				// we have exceeded the minimum batch
				break;
			}
			candidate_rows += entry->second->collection->Count();
		}
		if (candidate_rows < gstate.batch_size) {
			// not enough rows - cancel!
			return;
		}
	}
	// gather all collections we can repartition
	idx_t max_batch_index = 0;
	vector<unique_ptr<FixedRawBatchData>> raw_batches;
	for (auto entry = gstate.raw_batches.begin(); entry != gstate.raw_batches.end();) {
		if (entry->first >= min_index) {
			break;
		}
		max_batch_index = entry->first;
		raw_batches.push_back(std::move(entry->second));
		entry = gstate.raw_batches.erase(entry);
	}
	unique_ptr<FixedRawBatchData> append_batch;
	ColumnDataAppendState append_state;
	// now perform the actual repartitioning
	for (auto &current_batch : raw_batches) {
		if (!append_batch) {
			auto current_count = current_batch->collection->Count();
			if (CorrectSizeForBatch(current_count, gstate.batch_size)) {
				// the collection is ~approximately equal to the batch size (off by at most one vector)
				// use it directly
				task_manager.AddTask(
				    make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(current_batch)));
				current_batch.reset();
			} else if (current_count < gstate.batch_size) {
				// the collection is smaller than the batch size - use it as a starting point
				append_batch = std::move(current_batch);
				current_batch.reset();
			} else {
				// the collection is too large for a batch - we need to repartition
				// create an empty collection
				auto new_collection = make_uniq<ColumnDataCollection>(context, children[0].get().GetTypes());
				new_collection->SetPartitionIndex(0); // Makes the buffer manager less likely to spill this data
				append_batch = make_uniq<FixedRawBatchData>(0U, std::move(new_collection));
			}
			if (append_batch) {
				append_batch->collection->InitializeAppend(append_state);
			}
		}
		if (!current_batch) {
			// we have consumed the collection already - no need to append
			continue;
		}
		auto &current_collection = *current_batch->collection;
		append_batch->memory_usage += current_batch->memory_usage;
		// iterate the collection while appending
		for (auto &chunk : current_collection.Chunks()) {
			// append the chunk to the collection
			append_batch->collection->Append(append_state, chunk);
			if (append_batch->collection->Count() < gstate.batch_size) {
				// the collection is still under the batch size - continue
				continue;
			}
			// the collection is full - move it to the result and create a new one
			task_manager.AddTask(make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(append_batch)));

			auto new_collection = make_uniq<ColumnDataCollection>(context, children[0].get().GetTypes());
			new_collection->SetPartitionIndex(0); // Makes the buffer manager less likely to spill this data
			append_batch = make_uniq<FixedRawBatchData>(0U, std::move(new_collection));
			append_batch->collection->InitializeAppend(append_state);
		}
	}
	if (append_batch && append_batch->collection->Count() > 0) {
		// if there are any remaining batches that are not filled up to the batch size
		// AND this is not the final collection
		// re-add it to the set of raw (to-be-merged) batches
		if (final || CorrectSizeForBatch(append_batch->collection->Count(), gstate.batch_size)) {
			task_manager.AddTask(make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(append_batch)));
		} else {
			gstate.raw_batches[max_batch_index] = std::move(append_batch);
		}
	}
}